

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O0

btVector3 __thiscall btSliderConstraint::getAncorInA(btSliderConstraint *this)

{
  btTransform *in_RDI;
  float fVar1;
  btVector3 bVar2;
  btVector3 ancorInA;
  btVector3 *v;
  btVector3 *in_stack_ffffffffffffff58;
  btVector3 *this_00;
  undefined4 in_stack_ffffffffffffffb8;
  btVector3 local_18;
  
  this_00 = &local_18;
  btVector3::btVector3(this_00);
  v = in_RDI[0xf].m_basis.m_el + 2;
  fVar1 = (in_RDI[3].m_basis.m_el[1].m_floats[0] + in_RDI[3].m_basis.m_el[1].m_floats[1]) * 0.5;
  ::operator*((btScalar *)in_RDI,v);
  bVar2 = operator+(this_00,in_stack_ffffffffffffff58);
  local_18.m_floats._8_8_ = bVar2.m_floats._8_8_;
  local_18.m_floats._0_8_ = bVar2.m_floats._0_8_;
  btRigidBody::getCenterOfMassTransform(*(btRigidBody **)((in_RDI->m_basis).m_el[2].m_floats + 2));
  btTransform::inverse((btTransform *)CONCAT44(fVar1,in_stack_ffffffffffffffb8));
  bVar2 = btTransform::operator*(in_RDI,v);
  return (btVector3)bVar2.m_floats;
}

Assistant:

btVector3 btSliderConstraint::getAncorInA(void)
{
	btVector3 ancorInA;
	ancorInA = m_realPivotAInW + (m_lowerLinLimit + m_upperLinLimit) * btScalar(0.5) * m_sliderAxis;
	ancorInA = m_rbA.getCenterOfMassTransform().inverse() * ancorInA;
	return ancorInA;
}